

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O3

void __thiscall
amrex::MLCellABecLap::applyInhomogNeumannTerm(MLCellABecLap *this,int amrlev,Any *a_rhs)

{
  undefined8 uVar1;
  LinOpBCType LVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  __uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> _Var8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  FabArray<amrex::FArrayBox> *fabarray_;
  int *piVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  byte bVar19;
  byte bVar20;
  int iVar21;
  ulong extraout_RDX;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  long lVar45;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar46;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar47;
  Real fac;
  IntVect hi;
  IntVect low;
  Real fac_3;
  Real fac_4;
  Real fac_2;
  MFIter mfi;
  FArrayBox foo;
  ulong local_560;
  ulong local_558;
  bool local_544;
  long local_540;
  long local_538;
  long local_528;
  long local_518;
  Array4<double> local_4f0;
  ulong local_4b0;
  ulong local_4a8;
  long local_4a0;
  ulong local_498;
  uint local_48c;
  Array4<const_double> local_488;
  long local_448;
  ulong local_440;
  ulong local_438;
  ulong local_430;
  long local_428;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  ulong local_3c8;
  long local_3c0;
  long local_3b8;
  ulong local_3b0;
  uint local_3a4;
  int local_3a0;
  undefined4 local_39c;
  double local_398;
  long local_390;
  long local_388;
  long local_380;
  ulong local_378;
  long local_370;
  long local_368;
  ulong local_360;
  Array4<const_int> local_358;
  Array4<const_int> local_318;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  ulong local_2a0;
  Array4<const_double> local_298;
  int local_258;
  int local_254;
  LinOpBCType local_250;
  int local_24c;
  int local_248;
  int local_244;
  Array4<const_double> local_240;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  __uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  FabArray<amrex::FArrayBox> *local_1a8;
  MLCellABecLap *local_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  pointer local_168;
  ulong local_160;
  long local_158;
  LinOpBCType *local_150;
  LinOpBCType *local_148;
  long local_140;
  long local_138;
  long local_130;
  int *local_124;
  uint local_11c;
  int *local_118;
  int local_110;
  IndexType local_10c;
  MFIter local_108;
  BaseFab<double> local_a8;
  long local_60 [3];
  MFItInfo local_44;
  uint uVar30;
  
  bVar9 = MLLinOp::hasInhomogNeumannBC((MLLinOp *)this);
  bVar10 = MLLinOp::hasRobinBC((MLLinOp *)this);
  if (bVar9 || bVar10) {
    fabarray_ = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
    local_3a4 = (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[5])(this);
    lVar40 = (long)amrlev;
    local_188 = *(long *)&(this->super_MLCellLinOp).super_MLLinOp.m_geom.
                          super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar40].
                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    local_1d0 = *(double *)(local_188 + 0x58);
    local_1d8 = *(double *)(local_188 + 0x20);
    local_2c8 = *(double *)(local_188 + 0x38);
    local_2d0 = *(double *)(local_188 + 0x40);
    local_2d8 = *(double *)(local_188 + 0x48);
    (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x4c])(this);
    local_398 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x4e])
              (local_60,this,(ulong)(uint)amrlev,0);
    local_108.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
    local_108.fabArray = (FabArrayBase *)0x100000000;
    local_108.tile_size.vect[0] = 1;
    local_108.tile_size.vect[1] = 1;
    local_108.tile_size.vect[2] = 0;
    FArrayBox::FArrayBox((FArrayBox *)&local_a8,(Box *)&local_108,1,true,false,(Arena *)0x0);
    local_190 = *(long *)&(this->super_MLCellLinOp).m_maskvals.
                          super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar40].
                          super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                          .
                          super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
    ;
    local_1b0 = **(long **)&(this->super_MLCellLinOp).m_bcondloc.
                            super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar40].
                            super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
    ;
    local_1c8._M_t.
    super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
    super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
         (this->super_MLCellLinOp).m_bndry_sol.
         super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar40]._M_t.
         super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>._M_t;
    local_44.do_tiling = false;
    local_44.dynamic = true;
    local_44.device_sync = true;
    local_44.num_streams = Gpu::Device::max_gpu_streams;
    local_44.tilesize.vect[0] = 0;
    local_44.tilesize.vect[1] = 0;
    local_44.tilesize.vect[2] = 0;
    local_1a8 = fabarray_;
    local_178 = lVar40;
    MFIter::MFIter(&local_108,&fabarray_->super_FabArrayBase,&local_44);
    if (local_108.currentIndex < local_108.endIndex) {
      local_1c8._M_t.
      super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
      super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
           (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)
           ((long)local_1c8._M_t.
                  super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                  .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl + 8);
      local_1e0 = local_2d0 * local_398;
      local_1e8 = local_2c8 * local_398;
      local_398 = local_398 * local_2d8;
      local_1f0 = local_2d0 * local_1e0;
      local_1f8 = local_2c8 * local_1e8;
      local_200 = local_2d8 * local_398;
      local_160 = (ulong)local_3a4;
      local_408 = local_60[0];
      lVar40 = local_60[0];
      local_1a0 = this;
      do {
        BATransformer::operator()
                  ((Box *)&local_124,&((local_108.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_108.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_108.currentIndex] * 0x1c +
                          *(long *)&((((local_108.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_4f0,local_1a8,&local_108);
        piVar14 = &local_108.currentIndex;
        if (local_108.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar14 = ((local_108.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_108.currentIndex;
        }
        local_198 = (long *)((long)*piVar14 * 0x18 + *(long *)(local_1b0 + 0xf0));
        lVar41 = 0;
        do {
          if (lVar40 == 0) {
            local_488.begin.y = local_a8.domain.smallend.vect[1];
            local_488.begin.x = local_a8.domain.smallend.vect[0];
            local_488.p = local_a8.dptr;
            local_488.jstride =
                 ((long)local_a8.domain.bigend.vect[0] - (long)local_a8.domain.smallend.vect[0]) + 1
            ;
            local_488.kstride =
                 (((long)local_a8.domain.bigend.vect[1] + 1) -
                 (long)local_a8.domain.smallend.vect[1]) * local_488.jstride;
            local_488.nstride =
                 (((long)local_a8.domain.bigend.vect[2] + 1) -
                 (long)local_a8.domain.smallend.vect[2]) * local_488.kstride;
            local_488.begin.z = local_a8.domain.smallend.vect[2];
            local_488.end._0_8_ =
                 (long)local_a8.domain.bigend.vect[0] + 1U & 0xffffffff |
                 (long)local_a8.domain.bigend.vect[1] + 1 << 0x20;
            local_488.end.z = (int)((long)local_a8.domain.bigend.vect[2] + 1);
            local_488.ncomp = local_a8.nvar;
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_488,(FabArray<amrex::FArrayBox> *)local_60[lVar41],&local_108);
          }
          lVar15 = local_190;
          local_318.jstride._0_4_ = local_11c;
          local_318.p = local_124;
          local_358.jstride._0_4_ = local_110;
          local_358.p = local_118;
          iVar11 = *(int *)((long)&local_318.p + lVar41 * 4) + -1;
          *(int *)((long)&local_318.p + lVar41 * 4) = iVar11;
          *(int *)((long)&local_358.p + lVar41 * 4) = iVar11;
          iVar3 = (int)local_358.jstride;
          iVar5 = (int)local_318.p;
          uVar28 = (ulong)local_318.p & 0xffffffff;
          uVar6 = local_318.p._4_4_;
          local_4a8 = (ulong)(uint)local_318.jstride;
          local_438 = (ulong)local_358.p & 0xffffffff;
          local_498 = (ulong)local_358.p >> 0x20;
          local_318.jstride._0_4_ = local_11c;
          local_318.p = local_124;
          local_358.jstride._0_4_ = local_110;
          local_358.p = local_118;
          local_298.p = (double *)(CONCAT44(local_10c.itype >> 1,local_10c.itype) & 0x100000001);
          local_298.jstride._0_4_ = local_10c.itype >> 2 & 1;
          iVar11 = (~*(uint *)((long)&local_298.p + lVar41 * 4) & 1) +
                   *(int *)((long)&local_358.p + lVar41 * 4);
          *(int *)((long)&local_318.p + lVar41 * 4) = iVar11;
          *(int *)((long)&local_358.p + lVar41 * 4) = iVar11;
          iVar4 = (int)local_358.jstride;
          local_3b0 = (ulong)(int)local_318.p;
          iVar7 = local_318.p._4_4_;
          local_4b0 = (ulong)(uint)local_318.jstride;
          local_440 = (ulong)local_358.p & 0xffffffff;
          iVar11 = local_358.p._4_4_;
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    (&local_318,(FabArray<amrex::Mask> *)(local_190 + lVar41 * 0x180),&local_108);
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    (&local_358,(FabArray<amrex::Mask> *)(lVar15 + lVar41 * 0x180 + 0x480),
                     &local_108);
          _Var8._M_t.
          super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>.
          super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl =
               (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)
               (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)local_1c8;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_298,
                     (FabArray<amrex::FArrayBox> *)
                     &(((InterpBndryData *)
                       local_1c8._M_t.
                       super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                       .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl)->
                      super_BndryData).super_BndryRegister.bndry[lVar41 + -1].m_mf.
                      super_FabArray<amrex::FArrayBox>.os_temp,&local_108);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_240,
                     (FabArray<amrex::FArrayBox> *)
                     &(((InterpBndryData *)
                       _Var8._M_t.
                       super__Tuple_impl<0UL,_amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>
                       .super__Head_base<0UL,_amrex::MLMGBndry_*,_false>._M_head_impl)->
                      super_BndryData).super_BndryRegister.bndry[lVar41 + 2].m_mf.
                      super_FabArray<amrex::FArrayBox>.os_temp,&local_108);
          uVar29 = (uint)local_498;
          uVar30 = (uint)local_438;
          if (iVar5 < *(int *)(local_188 + 0xac)) {
            local_544 = false;
            uVar38 = extraout_RDX;
          }
          else {
            uVar38 = (ulong)uVar6;
            if (((((int)uVar6 < *(int *)(local_188 + 0xb0)) ||
                 ((int)local_4a8 < *(int *)(local_188 + 0xb4))) ||
                (*(int *)(local_188 + 0xb8) < (int)uVar30)) ||
               (*(int *)(local_188 + 0xbc) < (int)uVar29)) {
              local_544 = false;
            }
            else {
              local_544 = iVar3 <= *(int *)(local_188 + 0xc0);
            }
          }
          local_3c8 = local_3b0 & 0xffffffff;
          uVar12 = (uint)local_440;
          if ((((int)local_3b0 < *(int *)(local_188 + 0xac)) || (iVar7 < *(int *)(local_188 + 0xb0))
              ) || (((int)local_4b0 < *(int *)(local_188 + 0xb4) ||
                    ((*(int *)(local_188 + 0xb8) < (int)uVar12 ||
                     (*(int *)(local_188 + 0xbc) < iVar11)))))) {
            local_39c = 0;
          }
          else {
            local_39c = (undefined4)
                        CONCAT71((int7)(uVar38 >> 8),iVar4 <= *(int *)(local_188 + 0xc0));
          }
          bVar19 = (byte)local_39c;
          if ((local_544 & bVar19) == 0 && 0 < (int)local_3a4) {
            lVar15 = (long)iVar5;
            local_380 = (long)(int)uVar6;
            local_390 = (long)(int)local_4a8;
            local_388 = (long)iVar7;
            local_150 = ((local_1a0->super_MLCellLinOp).super_MLLinOp.m_lobc_orig.
                         super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar41;
            bVar20 = lVar40 == 0 & (local_1a0->super_MLCellLinOp).m_has_metric_term;
            local_148 = ((local_1a0->super_MLCellLinOp).super_MLLinOp.m_hibc_orig.
                         super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         .
                         super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar41;
            local_4a0 = lVar15 * 8;
            local_368 = lVar15 * 4;
            uVar16 = (uVar30 + 1) - iVar5;
            local_360 = (ulong)uVar16;
            local_130 = ~uVar30 + uVar28;
            iVar35 = (uVar30 + 1) - iVar5;
            iVar13 = (uVar12 + 1) - (int)local_3b0;
            local_138 = ~uVar12 + local_3c8;
            uVar17 = (uVar12 + 1) - (int)local_3b0;
            local_2a0 = (ulong)uVar17;
            local_180 = (long)local_108.currentIndex * 4;
            local_2b0 = (long)(int)local_4b0;
            local_158 = *local_198;
            local_168 = (local_1a0->super_MLCellLinOp).m_robin_bcval.
                        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            local_48c = uVar29 + 1;
            local_3f8 = iVar3 + 1;
            local_3f4 = iVar11 + 1;
            local_3fc = iVar4 + 1;
            local_244 = iVar5 + 1;
            local_248 = iVar5 + 1;
            local_258 = (int)local_4a8 + 1;
            local_448 = local_3b0 * 8;
            local_400 = iVar7 + -1;
            local_370 = local_3b0 * 4;
            local_3a0 = (int)local_4b0 + -1;
            local_1b8 = local_390 * 8;
            local_1c0 = local_380 * 8;
            local_2b8 = local_388 * 8;
            local_2c0 = local_2b0 * 8;
            local_24c = (int)local_3b0 + -1;
            local_254 = (int)local_3b0 + -1;
            local_410 = 8;
            local_418 = 0x10;
            local_420 = 0;
            local_538 = 0;
            uVar38 = 0;
            do {
              local_378 = uVar38;
              lVar40 = local_158 + local_378 * 0x18;
              iVar39 = *(int *)(lVar40 + 0xc + lVar41 * 4);
              LVar2 = local_150[local_378 * 3];
              iVar21 = (int)lVar41;
              if (LVar2 == inhomogNeumann && local_544 == false) {
                iVar27 = *(int *)(lVar40 + lVar41 * 4);
                if (iVar21 == 1) {
                  if (bVar20 == 0) {
                    local_558 = local_4a8 & 0xffffffff;
                    if ((int)local_4a8 <= iVar3) {
                      do {
                        if ((int)uVar6 <= (int)uVar29) {
                          lVar40 = (long)(int)local_558;
                          uVar44 = uVar6;
                          do {
                            if (iVar5 <= (int)uVar30) {
                              lVar22 = local_4f0.nstride * local_538 +
                                       (int)((uVar44 + 1) - local_4f0.begin.y) * local_4f0.jstride *
                                       8 + (lVar40 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_4a0;
                              lVar33 = 0;
                              do {
                                if ((iVar27 == 0x66) &&
                                   (local_318.p
                                    [lVar15 + (((long)(int)(uVar44 - local_318.begin.y) *
                                                CONCAT44(local_318.jstride._4_4_,
                                                         (uint)local_318.jstride) +
                                               (lVar40 - local_318.begin.z) * local_318.kstride +
                                               lVar33) - (long)local_318.begin.x)] == 2)) {
                                  uVar46 = 0;
                                  uVar47 = 0x3ff00000;
                                  if (local_408 != 0) {
                                    uVar1 = *(undefined8 *)
                                             ((long)local_488.p +
                                             lVar33 * 8 +
                                             local_488.nstride * local_538 +
                                             (int)((uVar44 + 1) - local_488.begin.y) *
                                             local_488.jstride * 8 +
                                             (lVar40 - local_488.begin.z) * local_488.kstride * 8 +
                                             (long)local_488.begin.x * -8 + local_4a0);
                                    uVar46 = (undefined4)uVar1;
                                    uVar47 = (undefined4)((ulong)uVar1 >> 0x20);
                                  }
                                  *(double *)((long)local_4f0.p + lVar33 * 8 + lVar22) =
                                       *(double *)((long)local_4f0.p + lVar33 * 8 + lVar22) -
                                       (double)CONCAT44(uVar47,uVar46) * local_1e0 *
                                       *(double *)
                                        ((long)local_298.p +
                                        lVar33 * 8 +
                                        local_298.nstride * local_538 +
                                        (lVar40 - local_298.begin.z) * local_298.kstride * 8 +
                                        (long)(int)(uVar44 - local_298.begin.y) *
                                        CONCAT44(local_298.jstride._4_4_,(uint)local_298.jstride) *
                                        8 + (long)local_298.begin.x * -8 + local_4a0);
                                }
                                lVar33 = lVar33 + 1;
                              } while (uVar16 != (uint)lVar33);
                            }
                            uVar44 = uVar44 + 1;
                          } while (uVar44 != local_48c);
                        }
                        bVar9 = (int)local_558 != iVar3;
                        local_558 = (ulong)((int)local_558 + 1);
                      } while (bVar9);
                    }
                  }
                  else {
                    uVar38 = local_4a8 & 0xffffffff;
                    if ((int)local_4a8 <= iVar3) {
                      do {
                        iVar31 = (int)uVar38;
                        if ((int)uVar6 <= (int)uVar29) {
                          lVar40 = (long)iVar31;
                          uVar44 = uVar6;
                          do {
                            if (iVar5 <= (int)uVar30) {
                              lVar22 = local_4f0.nstride * local_538 +
                                       (int)((uVar44 + 1) - local_4f0.begin.y) * local_4f0.jstride *
                                       8 + (lVar40 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_4a0;
                              lVar33 = 0;
                              do {
                                if ((iVar27 == 0x66) &&
                                   (local_318.p
                                    [lVar15 + (((long)(int)(uVar44 - local_318.begin.y) *
                                                CONCAT44(local_318.jstride._4_4_,
                                                         (uint)local_318.jstride) +
                                               (lVar40 - local_318.begin.z) * local_318.kstride +
                                               lVar33) - (long)local_318.begin.x)] == 2)) {
                                  *(double *)((long)local_4f0.p + lVar33 * 8 + lVar22) =
                                       *(double *)((long)local_4f0.p + lVar33 * 8 + lVar22) -
                                       (((double)(iVar5 + (int)lVar33) + 0.5) * local_1d8 +
                                       local_1d0) * local_1e0 *
                                       *(double *)
                                        ((long)local_298.p +
                                        lVar33 * 8 +
                                        local_298.nstride * local_538 +
                                        (lVar40 - local_298.begin.z) * local_298.kstride * 8 +
                                        (long)(int)(uVar44 - local_298.begin.y) *
                                        CONCAT44(local_298.jstride._4_4_,(uint)local_298.jstride) *
                                        8 + (long)local_298.begin.x * -8 + local_4a0);
                                }
                                lVar33 = lVar33 + 1;
                              } while ((int)local_130 + (int)lVar33 != 0);
                            }
                            uVar44 = uVar44 + 1;
                          } while (uVar44 != local_48c);
                        }
                        uVar38 = (ulong)(iVar31 + 1);
                      } while (iVar31 != iVar3);
                    }
                  }
                }
                else if (iVar21 == 0) {
                  if ((int)local_4a8 <= iVar3) {
                    local_560 = local_4a8;
                    do {
                      if ((int)uVar6 <= (int)uVar29) {
                        lVar40 = (long)(int)local_560;
                        uVar44 = uVar6;
                        do {
                          if (iVar5 <= (int)uVar30) {
                            lVar33 = (long)(int)uVar44;
                            lVar22 = (lVar33 - local_4f0.begin.y) * local_4f0.jstride;
                            lVar23 = (lVar40 - local_4f0.begin.z) * local_4f0.kstride;
                            lVar32 = 0;
                            do {
                              if ((iVar27 == 0x66) &&
                                 (local_318.p
                                  [lVar15 + (((lVar40 - local_318.begin.z) * local_318.kstride +
                                             (lVar33 - local_318.begin.y) *
                                             CONCAT44(local_318.jstride._4_4_,
                                                      (uint)local_318.jstride) + lVar32) -
                                            (long)local_318.begin.x)] == 2)) {
                                uVar46 = 0;
                                uVar47 = 0x3ff00000;
                                if (local_408 != 0) {
                                  uVar46 = SUB84(local_488.p
                                                 [(lVar33 - local_488.begin.y) * local_488.jstride +
                                                  (lVar40 - local_488.begin.z) * local_488.kstride +
                                                  local_488.nstride * local_378 +
                                                  (long)((int)lVar32 +
                                                        (local_244 - local_488.begin.x))],0);
                                  uVar47 = (undefined4)
                                           ((ulong)local_488.p
                                                   [(lVar33 - local_488.begin.y) * local_488.jstride
                                                    + (lVar40 - local_488.begin.z) *
                                                      local_488.kstride +
                                                      local_488.nstride * local_378 +
                                                      (long)((int)lVar32 +
                                                            (local_244 - local_488.begin.x))] >>
                                           0x20);
                                }
                                lVar34 = (long)((local_248 - local_4f0.begin.x) + (int)lVar32);
                                local_4f0.p
                                [lVar22 + lVar23 + local_4f0.nstride * local_378 + lVar34] =
                                     local_4f0.p
                                     [lVar22 + lVar23 + local_4f0.nstride * local_378 + lVar34] -
                                     (double)CONCAT44(uVar47,uVar46) * local_1e8 *
                                     *(double *)
                                      ((long)local_298.p +
                                      lVar32 * 8 +
                                      local_298.nstride * local_538 +
                                      (lVar33 - local_298.begin.y) *
                                      CONCAT44(local_298.jstride._4_4_,(uint)local_298.jstride) * 8
                                      + (lVar40 - local_298.begin.z) * local_298.kstride * 8 +
                                      (long)local_298.begin.x * -8 + local_4a0);
                              }
                              lVar32 = lVar32 + 1;
                            } while (iVar35 != (int)lVar32);
                          }
                          bVar9 = uVar44 != uVar29;
                          uVar44 = uVar44 + 1;
                        } while (bVar9);
                      }
                      bVar9 = (int)local_560 != iVar3;
                      local_560 = (ulong)((int)local_560 + 1);
                    } while (bVar9);
                  }
                }
                else {
                  uVar38 = local_4a8;
                  iVar31 = local_258;
                  if ((int)local_4a8 <= iVar3) {
                    do {
                      iVar18 = (int)uVar38;
                      uVar44 = uVar6;
                      if ((int)uVar6 <= (int)uVar29) {
                        do {
                          if (iVar5 <= (int)uVar30) {
                            lVar22 = (long)(int)uVar44;
                            lVar40 = local_4f0.nstride * local_538 +
                                     (iVar31 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                     (lVar22 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                     (long)local_4f0.begin.x * -8 + local_4a0;
                            lVar33 = 0;
                            do {
                              if ((iVar27 == 0x66) &&
                                 (local_318.p
                                  [lVar15 + ((((long)iVar18 - (long)local_318.begin.z) *
                                              local_318.kstride +
                                             (lVar22 - local_318.begin.y) *
                                             CONCAT44(local_318.jstride._4_4_,
                                                      (uint)local_318.jstride) + lVar33) -
                                            (long)local_318.begin.x)] == 2)) {
                                uVar46 = 0;
                                uVar47 = 0x3ff00000;
                                if (local_408 != 0) {
                                  uVar1 = *(undefined8 *)
                                           ((long)local_488.p +
                                           lVar33 * 8 +
                                           local_488.nstride * local_538 +
                                           (iVar31 - local_488.begin.z) * local_488.kstride * 8 +
                                           (lVar22 - local_488.begin.y) * local_488.jstride * 8 +
                                           (long)local_488.begin.x * -8 + local_4a0);
                                  uVar46 = (undefined4)uVar1;
                                  uVar47 = (undefined4)((ulong)uVar1 >> 0x20);
                                }
                                *(double *)((long)local_4f0.p + lVar33 * 8 + lVar40) =
                                     *(double *)((long)local_4f0.p + lVar33 * 8 + lVar40) -
                                     (double)CONCAT44(uVar47,uVar46) * local_398 *
                                     *(double *)
                                      ((long)local_298.p +
                                      lVar33 * 8 +
                                      local_298.nstride * local_538 +
                                      (lVar22 - local_298.begin.y) *
                                      CONCAT44(local_298.jstride._4_4_,(uint)local_298.jstride) * 8
                                      + ((long)iVar18 - (long)local_298.begin.z) * local_298.kstride
                                        * 8 + (long)local_298.begin.x * -8 + local_4a0);
                              }
                              lVar33 = lVar33 + 1;
                            } while (iVar35 != (int)lVar33);
                          }
                          bVar9 = uVar44 != uVar29;
                          uVar44 = uVar44 + 1;
                        } while (bVar9);
                      }
                      uVar38 = (ulong)(iVar18 + 1);
                      iVar31 = iVar31 + 1;
                    } while (iVar18 != iVar3);
                  }
                }
              }
              local_250 = local_148[local_378 * 3];
              if (local_250 == inhomogNeumann && bVar19 == 0) {
                if (iVar21 == 1) {
                  if (bVar20 == 0) {
                    local_560 = local_4b0 & 0xffffffff;
                    if ((int)local_4b0 <= iVar4) {
                      do {
                        if (iVar7 <= iVar11) {
                          lVar40 = (long)(int)local_560;
                          iVar27 = local_400;
                          iVar31 = iVar7;
                          do {
                            if ((int)local_3b0 <= (int)uVar12) {
                              lVar33 = (long)iVar31;
                              lVar22 = local_4f0.nstride * local_538 +
                                       (iVar27 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                       (lVar40 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_448;
                              lVar23 = 0;
                              do {
                                if ((iVar39 == 0x66) &&
                                   (local_358.p
                                    [local_3b0 +
                                     (((lVar40 - local_358.begin.z) * local_358.kstride +
                                      (lVar33 - local_358.begin.y) *
                                      CONCAT44(local_358.jstride._4_4_,(int)local_358.jstride) +
                                      lVar23) - (long)local_358.begin.x)] == 2)) {
                                  uVar46 = 0;
                                  uVar47 = 0x3ff00000;
                                  if (local_408 != 0) {
                                    uVar1 = *(undefined8 *)
                                             ((long)local_488.p +
                                             lVar23 * 8 +
                                             local_488.nstride * local_538 +
                                             (lVar33 - local_488.begin.y) * local_488.jstride * 8 +
                                             (lVar40 - local_488.begin.z) * local_488.kstride * 8 +
                                             (long)local_488.begin.x * -8 + local_448);
                                    uVar46 = (undefined4)uVar1;
                                    uVar47 = (undefined4)((ulong)uVar1 >> 0x20);
                                  }
                                  *(double *)((long)local_4f0.p + lVar23 * 8 + lVar22) =
                                       (double)CONCAT44(uVar47,uVar46) * local_1e0 *
                                       *(double *)
                                        ((long)local_240.p +
                                        lVar23 * 8 +
                                        local_240.nstride * local_538 +
                                        (lVar33 - local_240.begin.y) * local_240.jstride * 8 +
                                        (lVar40 - local_240.begin.z) * local_240.kstride * 8 +
                                        (long)local_240.begin.x * -8 + local_448) +
                                       *(double *)((long)local_4f0.p + lVar23 * 8 + lVar22);
                                }
                                lVar23 = lVar23 + 1;
                              } while (iVar13 != (int)lVar23);
                            }
                            iVar27 = iVar27 + 1;
                            bVar9 = iVar31 != iVar11;
                            iVar31 = iVar31 + 1;
                          } while (bVar9);
                        }
                        bVar9 = (int)local_560 != iVar4;
                        local_560 = (ulong)((int)local_560 + 1);
                      } while (bVar9);
                    }
                  }
                  else {
                    local_558 = local_4b0 & 0xffffffff;
                    if ((int)local_4b0 <= iVar4) {
                      do {
                        if (iVar7 <= iVar11) {
                          lVar40 = (long)(int)local_558;
                          iVar27 = local_400;
                          iVar31 = iVar7;
                          do {
                            if ((int)local_3b0 <= (int)uVar12) {
                              lVar22 = local_4f0.nstride * local_538 +
                                       (iVar27 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                       (lVar40 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_448;
                              lVar33 = 0;
                              do {
                                if ((iVar39 == 0x66) &&
                                   (local_358.p
                                    [local_3b0 +
                                     (((lVar40 - local_358.begin.z) * local_358.kstride +
                                      ((long)iVar31 - (long)local_358.begin.y) *
                                      CONCAT44(local_358.jstride._4_4_,(int)local_358.jstride) +
                                      lVar33) - (long)local_358.begin.x)] == 2)) {
                                  *(double *)((long)local_4f0.p + lVar33 * 8 + lVar22) =
                                       (((double)((int)local_3b0 + (int)lVar33) + 0.5) * local_1d8 +
                                       local_1d0) * local_1e0 *
                                       *(double *)
                                        ((long)local_240.p +
                                        lVar33 * 8 +
                                        local_240.nstride * local_538 +
                                        ((long)iVar31 - (long)local_240.begin.y) * local_240.jstride
                                        * 8 + (lVar40 - local_240.begin.z) * local_240.kstride * 8 +
                                        (long)local_240.begin.x * -8 + local_448) +
                                       *(double *)((long)local_4f0.p + lVar33 * 8 + lVar22);
                                }
                                lVar33 = lVar33 + 1;
                              } while ((int)local_138 + (int)lVar33 != 0);
                            }
                            iVar27 = iVar27 + 1;
                            bVar9 = iVar31 != iVar11;
                            iVar31 = iVar31 + 1;
                          } while (bVar9);
                        }
                        bVar9 = (int)local_558 != iVar4;
                        local_558 = (ulong)((int)local_558 + 1);
                      } while (bVar9);
                    }
                  }
                }
                else if (iVar21 == 0) {
                  if ((int)local_4b0 <= iVar4) {
                    local_560 = local_4b0;
                    do {
                      if (iVar7 <= iVar11) {
                        lVar40 = (long)(int)local_560;
                        iVar27 = iVar7;
                        do {
                          if ((int)local_3b0 <= (int)uVar12) {
                            lVar33 = (long)iVar27;
                            lVar22 = (lVar33 - local_4f0.begin.y) * local_4f0.jstride;
                            lVar23 = (lVar40 - local_4f0.begin.z) * local_4f0.kstride;
                            lVar32 = 0;
                            do {
                              if ((iVar39 == 0x66) &&
                                 (local_358.p
                                  [local_3b0 +
                                   (((lVar40 - local_358.begin.z) * local_358.kstride +
                                    (lVar33 - local_358.begin.y) *
                                    CONCAT44(local_358.jstride._4_4_,(int)local_358.jstride) +
                                    lVar32) - (long)local_358.begin.x)] == 2)) {
                                uVar46 = 0;
                                uVar47 = 0x3ff00000;
                                if (local_408 != 0) {
                                  uVar1 = *(undefined8 *)
                                           ((long)local_488.p +
                                           lVar32 * 8 +
                                           local_488.nstride * local_538 +
                                           (lVar33 - local_488.begin.y) * local_488.jstride * 8 +
                                           (lVar40 - local_488.begin.z) * local_488.kstride * 8 +
                                           (long)local_488.begin.x * -8 + local_448);
                                  uVar46 = (undefined4)uVar1;
                                  uVar47 = (undefined4)((ulong)uVar1 >> 0x20);
                                }
                                lVar34 = (long)((local_24c - local_4f0.begin.x) + (int)lVar32);
                                local_4f0.p
                                [lVar22 + lVar23 + local_4f0.nstride * local_378 + lVar34] =
                                     (double)CONCAT44(uVar47,uVar46) * local_1e8 *
                                     *(double *)
                                      ((long)local_240.p +
                                      lVar32 * 8 +
                                      local_240.nstride * local_538 +
                                      (lVar33 - local_240.begin.y) * local_240.jstride * 8 +
                                      (lVar40 - local_240.begin.z) * local_240.kstride * 8 +
                                      (long)local_240.begin.x * -8 + local_448) +
                                     local_4f0.p
                                     [lVar22 + lVar23 + local_4f0.nstride * local_378 + lVar34];
                              }
                              lVar32 = lVar32 + 1;
                            } while (iVar13 != (int)lVar32);
                          }
                          bVar9 = iVar27 != iVar11;
                          iVar27 = iVar27 + 1;
                        } while (bVar9);
                      }
                      bVar9 = (int)local_560 != iVar4;
                      local_560 = (ulong)((int)local_560 + 1);
                    } while (bVar9);
                  }
                }
                else if ((int)local_4b0 <= iVar4) {
                  local_558 = local_4b0;
                  iVar27 = local_3a0;
                  do {
                    if (iVar7 <= iVar11) {
                      lVar40 = (long)(int)local_558;
                      iVar31 = iVar7;
                      do {
                        if ((int)local_3b0 <= (int)uVar12) {
                          lVar33 = (long)iVar31;
                          lVar22 = local_4f0.nstride * local_538 +
                                   (iVar27 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                   (lVar33 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                   (long)local_4f0.begin.x * -8 + local_448;
                          lVar23 = 0;
                          do {
                            if ((iVar39 == 0x66) &&
                               (local_358.p
                                [local_3b0 +
                                 (((lVar40 - local_358.begin.z) * local_358.kstride +
                                  (lVar33 - local_358.begin.y) *
                                  CONCAT44(local_358.jstride._4_4_,(int)local_358.jstride) + lVar23)
                                 - (long)local_358.begin.x)] == 2)) {
                              uVar46 = 0;
                              uVar47 = 0x3ff00000;
                              if (local_408 != 0) {
                                uVar1 = *(undefined8 *)
                                         ((long)local_488.p +
                                         lVar23 * 8 +
                                         local_488.nstride * local_538 +
                                         (lVar33 - local_488.begin.y) * local_488.jstride * 8 +
                                         (lVar40 - local_488.begin.z) * local_488.kstride * 8 +
                                         (long)local_488.begin.x * -8 + local_448);
                                uVar46 = (undefined4)uVar1;
                                uVar47 = (undefined4)((ulong)uVar1 >> 0x20);
                              }
                              *(double *)((long)local_4f0.p + lVar23 * 8 + lVar22) =
                                   (double)CONCAT44(uVar47,uVar46) * local_398 *
                                   *(double *)
                                    ((long)local_240.p +
                                    lVar23 * 8 +
                                    local_240.nstride * local_538 +
                                    (lVar33 - local_240.begin.y) * local_240.jstride * 8 +
                                    (lVar40 - local_240.begin.z) * local_240.kstride * 8 +
                                    (long)local_240.begin.x * -8 + local_448) +
                                   *(double *)((long)local_4f0.p + lVar23 * 8 + lVar22);
                            }
                            lVar23 = lVar23 + 1;
                          } while (iVar13 != (int)lVar23);
                        }
                        bVar9 = iVar31 != iVar11;
                        iVar31 = iVar31 + 1;
                      } while (bVar9);
                    }
                    iVar27 = iVar27 + 1;
                    bVar9 = (int)local_558 != iVar4;
                    local_558 = (ulong)((int)local_558 + 1);
                  } while (bVar9);
                }
              }
              if (bVar10) {
                piVar14 = &local_108.currentIndex;
                if (local_108.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                  piVar14 = ((local_108.local_index_map)->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + local_108.currentIndex;
                }
                lVar40 = *(long *)(*(long *)((long)local_168[local_178]._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                            + 0x108) + (long)*piVar14 * 8);
                local_3d8 = *(long *)(lVar40 + 0x10);
                local_3e0 = (long)*(int *)(lVar40 + 0x18);
                local_3e8 = (long)*(int *)(lVar40 + 0x1c);
                local_3f0 = (long)*(int *)(lVar40 + 0x20);
                lVar22 = (long)((*(int *)(lVar40 + 0x24) - *(int *)(lVar40 + 0x18)) + 1);
                local_3d0 = (long)((*(int *)(lVar40 + 0x28) - *(int *)(lVar40 + 0x1c)) + 1);
                lVar40 = (long)((*(int *)(lVar40 + 0x2c) - *(int *)(lVar40 + 0x20)) + 1);
                if (LVar2 == Robin && local_544 == false) {
                  if (iVar21 == 1) {
                    if ((int)local_4a8 <= iVar3) {
                      lVar33 = local_3d8 + local_4a0 + local_3e0 * -8;
                      local_2a8 = local_3d0 * lVar22 * 8;
                      local_428 = (local_418 * lVar40 + local_1b8 + local_3f0 * -8) * local_3d0 +
                                  local_3e8 * -8;
                      local_3b8 = local_390;
                      do {
                        if ((int)uVar6 <= (int)uVar29) {
                          local_140 = (long)local_488.begin.y;
                          lVar23 = local_380;
                          do {
                            if (iVar5 <= (int)uVar30) {
                              lVar32 = ((lVar23 - local_4f0.begin.y) + 1) * local_4f0.jstride * 8 +
                                       local_4f0.nstride * local_538 +
                                       (local_3b8 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                       (long)local_4f0.begin.x * -8 + local_4a0;
                              lVar34 = 0;
                              do {
                                *(double *)((long)local_4f0.p + lVar34 * 8 + lVar32) =
                                     *(double *)
                                      ((long)local_488.p +
                                      lVar34 * 8 +
                                      ((lVar23 - local_140) + 1) * local_488.jstride * 8 +
                                      local_488.nstride * local_538 +
                                      (local_3b8 - local_488.begin.z) * local_488.kstride * 8 +
                                      (long)local_488.begin.x * -8 + local_4a0) * local_1f0 *
                                     (*(double *)
                                       ((local_428 + lVar23 * 8) * lVar22 + lVar33 + lVar34 * 8) /
                                     (*(double *)
                                       (((local_410 * lVar40 + local_1b8 + local_3f0 * -8) *
                                         local_3d0 + local_3e8 * -8 + lVar23 * 8) * lVar22 + lVar33
                                       + lVar34 * 8) * local_2d0 +
                                     *(double *)
                                      (((local_420 * lVar40 + local_1b8 + local_3f0 * -8) *
                                        local_3d0 + local_3e8 * -8 + lVar23 * 8) * lVar22 + lVar33 +
                                      lVar34 * 8) * 0.5)) +
                                     *(double *)((long)local_4f0.p + lVar34 * 8 + lVar32);
                                lVar34 = lVar34 + 1;
                              } while (uVar16 != (uint)lVar34);
                            }
                            iVar39 = (int)lVar23;
                            lVar23 = lVar23 + 1;
                          } while (local_48c != iVar39 + 1U);
                        }
                        local_3b8 = local_3b8 + 1;
                        lVar33 = lVar33 + local_2a8;
                      } while (local_3f8 != (int)local_3b8);
                    }
                  }
                  else if (iVar21 == 0) {
                    if ((int)local_4a8 <= iVar3) {
                      local_540 = local_4a0 + local_3d8;
                      local_560 = ((local_410 * lVar40 + local_1b8 + local_3f0 * -8) * local_3d0 +
                                   local_1c0 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_540
                      ;
                      lVar32 = local_3d0 * lVar22 * 8;
                      lVar33 = lVar22 * 8;
                      local_558 = ((local_420 * lVar40 + local_1b8 + local_3f0 * -8) * local_3d0 +
                                   local_1c0 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_540
                      ;
                      local_540 = ((local_418 * lVar40 + local_1b8 + local_3f0 * -8) * local_3d0 +
                                   local_1c0 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_540
                      ;
                      lVar23 = local_390;
                      do {
                        if ((int)uVar6 <= (int)uVar29) {
                          lVar26 = (long)local_4f0.p +
                                   local_4f0.nstride * local_538 +
                                   (local_380 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                   (lVar23 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                   (long)local_4f0.begin.x * -8 + local_4a0 + 8;
                          lVar36 = (long)local_488.p +
                                   local_488.nstride * local_538 +
                                   (local_380 - local_488.begin.y) * local_488.jstride * 8 +
                                   (lVar23 - local_488.begin.z) * local_488.kstride * 8 +
                                   (long)local_488.begin.x * -8 + local_4a0 + 8;
                          lVar34 = local_380;
                          uVar38 = local_558;
                          uVar43 = local_560;
                          lVar42 = local_540;
                          do {
                            if (iVar5 <= (int)uVar30) {
                              lVar24 = 0;
                              do {
                                *(double *)(lVar26 + lVar24 * 8) =
                                     *(double *)(lVar36 + lVar24 * 8) * local_1f8 *
                                     (*(double *)(lVar42 + lVar24 * 8) /
                                     (*(double *)(uVar43 + lVar24 * 8) * local_2c8 +
                                     *(double *)(uVar38 + lVar24 * 8) * 0.5)) +
                                     *(double *)(lVar26 + lVar24 * 8);
                                lVar24 = lVar24 + 1;
                              } while (uVar16 != (uint)lVar24);
                            }
                            lVar34 = lVar34 + 1;
                            uVar43 = uVar43 + lVar33;
                            uVar38 = uVar38 + lVar33;
                            lVar42 = lVar42 + lVar33;
                            lVar26 = lVar26 + local_4f0.jstride * 8;
                            lVar36 = lVar36 + local_488.jstride * 8;
                          } while (local_48c != (uint)lVar34);
                        }
                        lVar23 = lVar23 + 1;
                        local_560 = local_560 + lVar32;
                        local_558 = local_558 + lVar32;
                        local_540 = local_540 + lVar32;
                      } while (local_3f8 != (int)lVar23);
                    }
                  }
                  else if ((int)local_4a8 <= iVar3) {
                    lVar32 = local_3d8 + local_4a0 + local_3e0 * -8;
                    lVar34 = local_1c0 + local_3e8 * -8;
                    local_428 = local_410 * lVar40 + local_3f0 * -8;
                    lVar33 = lVar22 * 8;
                    local_3b8 = local_420 * lVar40 + local_3f0 * -8;
                    local_2a8 = local_418 * lVar40 + local_3f0 * -8;
                    lVar23 = local_390;
                    do {
                      if ((int)uVar6 <= (int)uVar29) {
                        lVar37 = (long)local_488.p +
                                 local_488.nstride * local_538 +
                                 (local_380 - local_488.begin.y) * local_488.jstride * 8 +
                                 ((lVar23 - local_488.begin.z) + 1) * local_488.kstride * 8 +
                                 (long)local_488.begin.x * -8 + local_4a0;
                        lVar25 = ((local_428 + lVar23 * 8) * local_3d0 + lVar34) * lVar22 + lVar32;
                        lVar36 = ((local_3b8 + lVar23 * 8) * local_3d0 + lVar34) * lVar22 + lVar32;
                        lVar26 = ((local_2a8 + lVar23 * 8) * local_3d0 + lVar34) * lVar22 + lVar32;
                        lVar24 = (long)local_4f0.p +
                                 local_4f0.nstride * local_538 +
                                 (local_380 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                 ((lVar23 - local_4f0.begin.z) + 1) * local_4f0.kstride * 8 +
                                 (long)local_4f0.begin.x * -8 + local_4a0;
                        lVar42 = local_380;
                        do {
                          if (iVar5 <= (int)uVar30) {
                            lVar45 = 0;
                            do {
                              *(double *)(lVar24 + lVar45 * 8) =
                                   *(double *)(lVar37 + lVar45 * 8) * local_200 *
                                   (*(double *)(lVar26 + lVar45 * 8) /
                                   (*(double *)(lVar25 + lVar45 * 8) * local_2d8 +
                                   *(double *)(lVar36 + lVar45 * 8) * 0.5)) +
                                   *(double *)(lVar24 + lVar45 * 8);
                              lVar45 = lVar45 + 1;
                            } while (uVar16 != (uint)lVar45);
                          }
                          lVar42 = lVar42 + 1;
                          lVar37 = lVar37 + local_488.jstride * 8;
                          lVar25 = lVar25 + lVar33;
                          lVar36 = lVar36 + lVar33;
                          lVar26 = lVar26 + lVar33;
                          lVar24 = lVar24 + local_4f0.jstride * 8;
                        } while (local_48c != (uint)lVar42);
                      }
                      lVar23 = lVar23 + 1;
                    } while (local_3f8 != (int)lVar23);
                  }
                }
                if (local_250 == Robin && bVar19 == 0) {
                  if (iVar21 == 1) {
                    if ((int)local_4b0 <= iVar4) {
                      local_528 = local_3d8 + local_448;
                      local_558 = ((local_410 * lVar40 + local_2c0 + local_3f0 * -8) * local_3d0 +
                                   local_2b8 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_528
                      ;
                      lVar23 = local_3d0 * lVar22 * 8;
                      lVar33 = lVar22 * 8;
                      local_540 = ((local_420 * lVar40 + local_2c0 + local_3f0 * -8) * local_3d0 +
                                   local_2b8 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_528
                      ;
                      local_528 = ((lVar40 * local_418 + local_2c0 + local_3f0 * -8) * local_3d0 +
                                   local_2b8 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_528
                      ;
                      local_560 = local_2b0;
                      do {
                        if (iVar7 <= iVar11) {
                          lVar34 = (long)local_488.p +
                                   local_488.nstride * local_538 +
                                   (local_388 - local_488.begin.y) * local_488.jstride * 8 +
                                   (local_560 - (long)local_488.begin.z) * local_488.kstride * 8 +
                                   (long)local_488.begin.x * -8 + local_448;
                          iVar39 = local_400 - local_4f0.begin.y;
                          lVar40 = local_388;
                          lVar22 = local_540;
                          uVar38 = local_558;
                          lVar32 = local_528;
                          do {
                            if ((int)local_3b0 <= (int)uVar12) {
                              lVar42 = (long)iVar39 * local_4f0.jstride * 8 +
                                       local_4f0.nstride * local_538 +
                                       (local_560 - (long)local_4f0.begin.z) * local_4f0.kstride * 8
                                       + (long)local_4f0.begin.x * -8 + local_448;
                              lVar26 = 0;
                              do {
                                *(double *)((long)local_4f0.p + lVar26 * 8 + lVar42) =
                                     *(double *)(lVar34 + lVar26 * 8) * local_1f0 *
                                     (*(double *)(lVar32 + lVar26 * 8) /
                                     (*(double *)(uVar38 + lVar26 * 8) * local_2d0 +
                                     *(double *)(lVar22 + lVar26 * 8) * 0.5)) +
                                     *(double *)((long)local_4f0.p + lVar26 * 8 + lVar42);
                                lVar26 = lVar26 + 1;
                              } while (uVar17 != (uint)lVar26);
                            }
                            lVar40 = lVar40 + 1;
                            lVar34 = lVar34 + local_488.jstride * 8;
                            uVar38 = uVar38 + lVar33;
                            lVar22 = lVar22 + lVar33;
                            lVar32 = lVar32 + lVar33;
                            iVar39 = iVar39 + 1;
                          } while (local_3f4 != (int)lVar40);
                        }
                        local_560 = local_560 + 1;
                        local_558 = local_558 + lVar23;
                        local_540 = local_540 + lVar23;
                        local_528 = local_528 + lVar23;
                      } while (local_3fc != (int)local_560);
                    }
                  }
                  else if (iVar21 == 0) {
                    if ((int)local_4b0 <= iVar4) {
                      local_528 = local_3d8 + local_448;
                      local_518 = ((local_410 * lVar40 + local_2c0 + local_3f0 * -8) * local_3d0 +
                                   local_2b8 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_528
                      ;
                      lVar23 = local_3d0 * lVar22 * 8;
                      lVar33 = lVar22 * 8;
                      local_428 = ((local_420 * lVar40 + local_2c0 + local_3f0 * -8) * local_3d0 +
                                   local_2b8 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_528
                      ;
                      local_528 = ((lVar40 * local_418 + local_2c0 + local_3f0 * -8) * local_3d0 +
                                   local_2b8 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_528
                      ;
                      lVar40 = local_2b0;
                      do {
                        if (iVar7 <= iVar11) {
                          lVar36 = (lVar40 - local_4f0.begin.z) * local_4f0.kstride;
                          lVar26 = (long)local_488.p +
                                   local_488.nstride * local_538 +
                                   (local_388 - local_488.begin.y) * local_488.jstride * 8 +
                                   (lVar40 - local_488.begin.z) * local_488.kstride * 8 +
                                   (long)local_488.begin.x * -8 + local_448;
                          lVar22 = local_518;
                          lVar32 = local_388;
                          lVar34 = local_428;
                          lVar42 = local_528;
                          do {
                            if ((int)local_3b0 <= (int)uVar12) {
                              lVar24 = (lVar32 - local_4f0.begin.y) * local_4f0.jstride;
                              lVar37 = 0;
                              do {
                                lVar25 = (long)((local_254 - local_4f0.begin.x) + (int)lVar37);
                                local_4f0.p
                                [lVar36 + local_4f0.nstride * local_378 + lVar24 + lVar25] =
                                     *(double *)(lVar26 + lVar37 * 8) * local_1f8 *
                                     (*(double *)(lVar42 + lVar37 * 8) /
                                     (*(double *)(lVar22 + lVar37 * 8) * local_2c8 +
                                     *(double *)(lVar34 + lVar37 * 8) * 0.5)) +
                                     local_4f0.p
                                     [lVar36 + local_4f0.nstride * local_378 + lVar24 + lVar25];
                                lVar37 = lVar37 + 1;
                              } while (uVar17 != (uint)lVar37);
                            }
                            lVar32 = lVar32 + 1;
                            lVar26 = lVar26 + local_488.jstride * 8;
                            lVar22 = lVar22 + lVar33;
                            lVar34 = lVar34 + lVar33;
                            lVar42 = lVar42 + lVar33;
                          } while (local_3f4 != (int)lVar32);
                        }
                        lVar40 = lVar40 + 1;
                        local_518 = local_518 + lVar23;
                        local_428 = local_428 + lVar23;
                        local_528 = local_528 + lVar23;
                      } while (local_3fc != (int)lVar40);
                    }
                  }
                  else if ((int)local_4b0 <= iVar4) {
                    local_528 = local_3d8 + local_448;
                    local_560 = ((local_410 * lVar40 + local_2c0 + local_3f0 * -8) * local_3d0 +
                                 local_2b8 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_528;
                    local_428 = local_3d0 * lVar22 * 8;
                    lVar33 = lVar22 * 8;
                    local_558 = ((local_420 * lVar40 + local_2c0 + local_3f0 * -8) * local_3d0 +
                                 local_2b8 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_528;
                    local_528 = ((lVar40 * local_418 + local_2c0 + local_3f0 * -8) * local_3d0 +
                                 local_2b8 + local_3e8 * -8) * lVar22 + local_3e0 * -8 + local_528;
                    lVar40 = local_2b0;
                    iVar39 = local_3a0;
                    do {
                      if (iVar7 <= iVar11) {
                        lVar32 = (long)local_488.p +
                                 local_488.nstride * local_538 +
                                 (local_388 - local_488.begin.y) * local_488.jstride * 8 +
                                 (lVar40 - local_488.begin.z) * local_488.kstride * 8 +
                                 (long)local_488.begin.x * -8 + local_448;
                        lVar34 = (long)local_4f0.p +
                                 local_4f0.nstride * local_538 +
                                 (local_388 - local_4f0.begin.y) * local_4f0.jstride * 8 +
                                 (iVar39 - local_4f0.begin.z) * local_4f0.kstride * 8 +
                                 (long)local_4f0.begin.x * -8 + local_448;
                        lVar22 = local_388;
                        uVar38 = local_560;
                        lVar23 = local_528;
                        uVar43 = local_558;
                        do {
                          if ((int)local_3b0 <= (int)uVar12) {
                            lVar42 = 0;
                            do {
                              *(double *)(lVar34 + lVar42 * 8) =
                                   *(double *)(lVar32 + lVar42 * 8) * local_200 *
                                   (*(double *)(lVar23 + lVar42 * 8) /
                                   (*(double *)(uVar38 + lVar42 * 8) * local_2d8 +
                                   *(double *)(uVar43 + lVar42 * 8) * 0.5)) +
                                   *(double *)(lVar34 + lVar42 * 8);
                              lVar42 = lVar42 + 1;
                            } while (uVar17 != (uint)lVar42);
                          }
                          lVar22 = lVar22 + 1;
                          lVar32 = lVar32 + local_488.jstride * 8;
                          uVar38 = uVar38 + lVar33;
                          uVar43 = uVar43 + lVar33;
                          lVar23 = lVar23 + lVar33;
                          lVar34 = lVar34 + local_4f0.jstride * 8;
                        } while (local_3f4 != (int)lVar22);
                      }
                      lVar40 = lVar40 + 1;
                      local_560 = local_560 + local_428;
                      local_558 = local_558 + local_428;
                      local_528 = local_528 + local_428;
                      iVar39 = iVar39 + 1;
                    } while (local_3fc != (int)lVar40);
                  }
                }
              }
              local_538 = local_538 + 8;
              local_410 = local_410 + 0x18;
              local_420 = local_420 + 0x18;
              local_418 = local_418 + 0x18;
              uVar38 = local_378 + 1;
              lVar40 = local_408;
              local_3c0 = lVar41;
            } while (local_378 + 1 != local_160);
          }
          lVar41 = lVar41 + 1;
          local_430 = uVar28;
        } while (lVar41 != 3);
        MFIter::operator++(&local_108);
      } while (local_108.currentIndex < local_108.endIndex);
    }
    MFIter::~MFIter(&local_108);
    local_a8._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00712bd8;
    BaseFab<double>::clear(&local_a8);
  }
  return;
}

Assistant:

void
MLCellABecLap::applyInhomogNeumannTerm (int amrlev, Any& a_rhs) const
{
    bool has_inhomog_neumann = hasInhomogNeumannBC();
    bool has_robin = hasRobinBC();

    if (!has_inhomog_neumann && !has_robin) return;

    AMREX_ASSERT(a_rhs.is<MultiFab>());
    MultiFab& rhs = a_rhs.get<MultiFab>();

    int ncomp = getNComp();
    const int mglev = 0;

    const auto problo = m_geom[amrlev][mglev].ProbLoArray();
    const auto probhi = m_geom[amrlev][mglev].ProbHiArray();
    amrex::ignore_unused(probhi);
    const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
    const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
    const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);
    const Real xlo = problo[0];
    const Real dx = m_geom[amrlev][mglev].CellSize(0);
    const Box& domain = m_geom[amrlev][mglev].Domain();

    const Real beta = getBScalar();
    Array<MultiFab const*, AMREX_SPACEDIM> const& bcoef = getBCoeffs(amrlev,mglev);
    FArrayBox foo(Box(IntVect(0),IntVect(1)));
    bool has_bcoef = (bcoef[0] != nullptr);

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];
    const auto& bndry = *m_bndry_sol[amrlev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rhs, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.validbox();
        Array4<Real> const& rhsfab = rhs.array(mfi);

        const auto & bdlv = bcondloc.bndryLocs(mfi);
        const auto & bdcv = bcondloc.bndryConds(mfi);

        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            Array4<Real const> const bfab = (has_bcoef)
                ? bcoef[idim]->const_array(mfi) : foo.const_array();
            const Orientation olo(idim,Orientation::low);
            const Orientation ohi(idim,Orientation::high);
            const Box blo = amrex::adjCellLo(vbx, idim);
            const Box bhi = amrex::adjCellHi(vbx, idim);
            const auto& mlo = maskvals[olo].array(mfi);
            const auto& mhi = maskvals[ohi].array(mfi);
            const auto& bvlo = bndry.bndryValues(olo).array(mfi);
            const auto& bvhi = bndry.bndryValues(ohi).array(mfi);
            bool outside_domain_lo = !(domain.contains(blo));
            bool outside_domain_hi = !(domain.contains(bhi));
            if ((!outside_domain_lo) && (!outside_domain_hi)) continue;
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                const BoundCond bctlo = bdcv[icomp][olo];
                const BoundCond bcthi = bdcv[icomp][ohi];
                const Real bcllo = bdlv[icomp][olo];
                const Real bclhi = bdlv[icomp][ohi];
                if (m_lobc_orig[icomp][idim] == LinOpBCType::inhomogNeumann && outside_domain_lo)
                {
                    if (idim == 0) {
                        Real fac = beta*dxi;
                        if (m_has_metric_term && !has_bcoef) {
#if (AMREX_SPACEDIM == 1)
                            fac *= problo[0]*problo[0];
#elif (AMREX_SPACEDIM == 2)
                            fac *= problo[0];
#endif
                        }
                        AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                        {
                            mllinop_apply_innu_xlo(i,j,k, rhsfab, mlo, bfab,
                                                   bctlo, bcllo, bvlo,
                                                   fac, has_bcoef, icomp);
                        });
                    } else if (idim == 1) {
                        Real fac = beta*dyi;
                        if (m_has_metric_term && !has_bcoef) {
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                mllinop_apply_innu_ylo_m(i,j,k, rhsfab, mlo,
                                                         bctlo, bcllo, bvlo,
                                                         fac, xlo, dx, icomp);
                            });
                        }
                        else {
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                mllinop_apply_innu_ylo(i,j,k, rhsfab, mlo, bfab,
                                                       bctlo, bcllo, bvlo,
                                                       fac, has_bcoef, icomp);
                            });
                        }
                    } else {
                        Real fac = beta*dzi;
                        AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                        {
                            mllinop_apply_innu_zlo(i,j,k, rhsfab, mlo, bfab,
                                                   bctlo, bcllo, bvlo,
                                                   fac, has_bcoef, icomp);
                        });
                    }
                }
                if (m_hibc_orig[icomp][idim] == LinOpBCType::inhomogNeumann && outside_domain_hi)
                {
                    if (idim == 0) {
                        Real fac = beta*dxi;
                        if (m_has_metric_term && !has_bcoef) {
#if (AMREX_SPACEDIM == 1)
                            fac *= probhi[0]*probhi[0];
#elif (AMREX_SPACEDIM == 2)
                            fac *= probhi[0];
#endif
                        }
                        AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                        {
                            mllinop_apply_innu_xhi(i,j,k, rhsfab, mhi, bfab,
                                                   bcthi, bclhi, bvhi,
                                                   fac, has_bcoef, icomp);
                        });
                    } else if (idim == 1) {
                        Real fac = beta*dyi;
                        if (m_has_metric_term && !has_bcoef) {
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                mllinop_apply_innu_yhi_m(i,j,k, rhsfab, mhi,
                                                         bcthi, bclhi, bvhi,
                                                         fac, xlo, dx, icomp);
                            });
                        } else {
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                mllinop_apply_innu_yhi(i,j,k, rhsfab, mhi, bfab,
                                                       bcthi, bclhi, bvhi,
                                                       fac, has_bcoef, icomp);
                            });
                        }
                    } else {
                        Real fac = beta*dzi;
                        AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                        {
                            mllinop_apply_innu_zhi(i,j,k, rhsfab, mhi, bfab,
                                                   bcthi, bclhi, bvhi,
                                                   fac, has_bcoef, icomp);
                        });
                    }
                }

                if (has_robin) {
                    // For Robin BC, see comments in AMReX_MLABecLaplacian.cpp above
                    // function applyRobinBCTermsCoeffs.
                    Array4<Real const> const& rbc = (*m_robin_bcval[amrlev])[mfi].const_array(icomp*3);
                    if (m_lobc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_lo)
                    {
                        if (idim == 0) {
                            Real fac = beta*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i+1,j,k,icomp) += fac*bfab(i+1,j,k,icomp)*A;
                            });
                        } else if (idim == 1) {
                            Real fac = beta*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j+1,k,icomp) += fac*bfab(i,j+1,k,icomp)*A;
                            });
                        } else {
                            Real fac = beta*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j,k+1,icomp) += fac*bfab(i,j,k+1,icomp)*A;
                            });
                        }
                    }
                    if (m_hibc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_hi)
                    {
                        if (idim == 0) {
                            Real fac = beta*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i-1,j,k,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        } else if (idim == 1) {
                            Real fac = beta*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j-1,k,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        } else {
                            Real fac = beta*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j,k-1,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        }
                    }
                }
            }
        }

    }
}